

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void malloc_mutex_lock(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  _Bool _Var1;
  witness_t *in_RSI;
  tsdn_t *in_RDI;
  tsd_t *tsd_1;
  tsd_t *tsd;
  uint8_t state;
  uint8_t state_1;
  witness_tsd_t *local_98;
  witness_tsd_t *local_80;
  malloc_mutex_t *in_stack_ffffffffffffffb8;
  
  if (in_RDI == (tsdn_t *)0x0) {
    local_80 = (witness_tsd_t *)0x0;
  }
  else {
    local_80 = &(in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
  }
  witness_assert_not_owner((witness_tsdn_t *)local_80,in_RSI);
  _Var1 = malloc_mutex_trylock_final((malloc_mutex_t *)0x27764c);
  if (_Var1) {
    malloc_mutex_lock_slow(in_stack_ffffffffffffffb8);
    *(undefined1 *)&in_RSI[2].rank = 1;
  }
  mutex_owner_stats_update(in_RDI,(malloc_mutex_t *)in_RSI);
  if (in_RDI == (tsdn_t *)0x0) {
    local_98 = (witness_tsd_t *)0x0;
  }
  else {
    local_98 = &(in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
  }
  witness_lock((witness_tsdn_t *)local_98,in_RSI);
  return;
}

Assistant:

static inline void
malloc_mutex_lock(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	witness_assert_not_owner(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
	if (isthreaded) {
		if (malloc_mutex_trylock_final(mutex)) {
			malloc_mutex_lock_slow(mutex);
			atomic_store_b(&mutex->locked, true, ATOMIC_RELAXED);
		}
		mutex_owner_stats_update(tsdn, mutex);
	}
	witness_lock(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
}